

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall QMakeParser::bogusTest(QMakeParser *this,ushort **tokPtr,QString *msg)

{
  if ((msg->d).size != 0) {
    parseError(this,msg);
  }
  flushScopes(this,tokPtr);
  this->m_invert = 0;
  this->m_operator = NoOperator;
  this->m_state = StCond;
  this->m_canElse = true;
  return;
}

Assistant:

void QMakeParser::bogusTest(ushort *&tokPtr, const QString &msg)
{
    if (!msg.isEmpty())
        parseError(msg);
    flushScopes(tokPtr);
    m_operator = NoOperator;
    m_invert = 0;
    m_state = StCond;
    m_canElse = true;
}